

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS
fun3d_field_scalar(REF_GRID_conflict ref_grid,REF_INT ldim,REF_DBL *initial_field,char *interpolant,
                  REF_DBL *scalar)

{
  REF_DBL RVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double local_178;
  double local_168;
  double local_160;
  double local_150;
  double local_148;
  double local_138;
  double local_130;
  double local_120;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_DBL *pRStack_100;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_DBL *solb_scalar;
  double dStack_f0;
  REF_INT solb_ldim;
  REF_DBL mach2_1;
  REF_DBL u2_2;
  REF_DBL temp_1;
  REF_DBL press_1;
  REF_DBL w_1;
  REF_DBL v_2;
  REF_DBL u_2;
  REF_DBL rho_1;
  REF_DBL mach2;
  REF_DBL u2_1;
  REF_DBL temp;
  REF_DBL press;
  REF_DBL v_1;
  REF_DBL u_1;
  REF_DBL rho;
  REF_DBL u2;
  REF_DBL w;
  REF_DBL v;
  REF_DBL u;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL recognized;
  REF_DBL gamma;
  REF_MPI pRStack_40;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_DBL *scalar_local;
  char *interpolant_local;
  REF_DBL *initial_field_local;
  REF_GRID_conflict pRStack_18;
  REF_INT ldim_local;
  REF_GRID_conflict ref_grid_local;
  
  pRStack_40 = ref_grid->mpi;
  _ref_private_macro_code_rss = 1.4;
  u._4_4_ = 0;
  ref_mpi = (REF_MPI)scalar;
  scalar_local = (REF_DBL *)interpolant;
  interpolant_local = (char *)initial_field;
  initial_field_local._4_4_ = ldim;
  pRStack_18 = ref_grid;
  u._0_4_ = ref_validation_finite(ref_grid,ldim,initial_field);
  if (u._0_4_ != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x9c0,"fun3d_field_scalar",(ulong)u._0_4_,"init field");
    return u._0_4_;
  }
  if (pRStack_40->id == 0) {
    printf("compute %s\n",scalar_local);
  }
  iVar2 = strcmp((char *)scalar_local,"incomp");
  if (iVar2 == 0) {
    u._4_4_ = 1;
    if (initial_field_local._4_4_ < 4) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x9c5,"fun3d_field_scalar","expected 4 or more variables per vertex for incompressible"
            );
      return 1;
    }
    for (gamma._4_4_ = 0; gamma._4_4_ < pRStack_18->node->max; gamma._4_4_ = gamma._4_4_ + 1) {
      if (((-1 < gamma._4_4_) && (gamma._4_4_ < pRStack_18->node->max)) &&
         (-1 < pRStack_18->node->global[gamma._4_4_])) {
        v = *(REF_DBL *)(interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_) * 8);
        w = *(REF_DBL *)
             (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 1) * 8);
        u2 = *(REF_DBL *)
              (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 2) * 8);
        rho = u2 * u2 + v * v + w * w;
        dVar4 = sqrt(rho);
        *(double *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = dVar4;
      }
    }
    ref_mpi_stopwatch_stop(pRStack_40,"compute incompressible scalar");
  }
  iVar2 = strcmp((char *)scalar_local,"space-time");
  if (iVar2 == 0) {
    u._4_4_ = 1;
    if (initial_field_local._4_4_ < 4) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x9d3,"fun3d_field_scalar","expected 4 or more variables per vertex for space-time");
      return 1;
    }
    for (gamma._4_4_ = 0; gamma._4_4_ < pRStack_18->node->max; gamma._4_4_ = gamma._4_4_ + 1) {
      if (((-1 < gamma._4_4_) && (gamma._4_4_ < pRStack_18->node->max)) &&
         (-1 < pRStack_18->node->global[gamma._4_4_])) {
        u_1 = *(REF_DBL *)(interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_) * 8);
        v_1 = *(REF_DBL *)
               (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 1) * 8);
        press = *(REF_DBL *)
                 (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 2) * 8);
        temp = *(REF_DBL *)
                (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 3) * 8);
        if (u_1 * 1e+20 <= 0.0) {
          local_120 = -(u_1 * 1e+20);
        }
        else {
          local_120 = u_1 * 1e+20;
        }
        local_130 = temp;
        if (temp <= 0.0) {
          local_130 = -temp;
        }
        if (local_120 <= local_130) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x9dc,"fun3d_field_scalar","can not divide by rho");
          printf("rho = %e  u = %e  v = %e  press = %e\n",u_1,v_1,press,temp);
          return 1;
        }
        u2_1 = _ref_private_macro_code_rss * (temp / u_1);
        mach2 = v_1 * v_1 + press * press;
        if (u2_1 * 1e+20 <= 0.0) {
          local_138 = -(u2_1 * 1e+20);
        }
        else {
          local_138 = u2_1 * 1e+20;
        }
        local_148 = mach2;
        if (mach2 <= 0.0) {
          local_148 = -mach2;
        }
        if (local_138 <= local_148) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x9e2,"fun3d_field_scalar","can not divide by temp");
          printf("rho = %e  u = %e  v = %e  press = %e  temp = %e\n",u_1,v_1,press,temp,u2_1);
          return 1;
        }
        rho_1 = mach2 / u2_1;
        if (rho_1 < 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x9e7,"fun3d_field_scalar","negative mach2");
          printf("rho = %e  u = %e  v = %e press = %e  temp = %e\n",u_1,v_1,press,temp,u2_1);
          return 1;
        }
        dVar4 = sqrt(rho_1);
        *(double *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = dVar4;
      }
    }
    ref_mpi_stopwatch_stop(pRStack_40,"compute incompressible scalar");
  }
  iVar2 = strcmp((char *)scalar_local,"mach");
  if (((iVar2 == 0) || (iVar2 = strcmp((char *)scalar_local,"htot"), iVar2 == 0)) ||
     ((iVar2 = strcmp((char *)scalar_local,"ptot"), iVar2 == 0 ||
      (((iVar2 = strcmp((char *)scalar_local,"pressure"), iVar2 == 0 ||
        (iVar2 = strcmp((char *)scalar_local,"density"), iVar2 == 0)) ||
       (iVar2 = strcmp((char *)scalar_local,"temperature"), iVar2 == 0)))))) {
    if (initial_field_local._4_4_ < 5) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0x9f2,"fun3d_field_scalar","expected 5 or more variables per vertex for compressible");
      return 1;
    }
    for (gamma._4_4_ = 0; gamma._4_4_ < pRStack_18->node->max; gamma._4_4_ = gamma._4_4_ + 1) {
      if (((-1 < gamma._4_4_) && (gamma._4_4_ < pRStack_18->node->max)) &&
         (-1 < pRStack_18->node->global[gamma._4_4_])) {
        u_2 = *(REF_DBL *)(interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_) * 8);
        v_2 = *(REF_DBL *)
               (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 1) * 8);
        w_1 = *(REF_DBL *)
               (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 2) * 8);
        press_1 = *(REF_DBL *)
                   (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 3) * 8);
        temp_1 = *(REF_DBL *)
                  (interpolant_local + (long)(initial_field_local._4_4_ * gamma._4_4_ + 4) * 8);
        if (u_2 * 1e+20 <= 0.0) {
          local_150 = -(u_2 * 1e+20);
        }
        else {
          local_150 = u_2 * 1e+20;
        }
        local_160 = temp_1;
        if (temp_1 <= 0.0) {
          local_160 = -temp_1;
        }
        if (local_150 <= local_160) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0x9fd,"fun3d_field_scalar","can not divide by rho");
          printf("rho = %e  u = %e  v = %e  w = %e  press = %e\n",u_2,v_2,w_1,press_1,temp_1);
          return 1;
        }
        u2_2 = _ref_private_macro_code_rss * (temp_1 / u_2);
        mach2_1 = press_1 * press_1 + v_2 * v_2 + w_1 * w_1;
        if (u2_2 * 1e+20 <= 0.0) {
          local_168 = -(u2_2 * 1e+20);
        }
        else {
          local_168 = u2_2 * 1e+20;
        }
        local_178 = mach2_1;
        if (mach2_1 <= 0.0) {
          local_178 = -mach2_1;
        }
        if (local_168 <= local_178) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xa03,"fun3d_field_scalar","can not divide by temp");
          printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n",u_2,v_2,w_1,press_1,
                 temp_1,u2_2);
          return 1;
        }
        dStack_f0 = mach2_1 / u2_2;
        if (dStack_f0 < 0.0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xa08,"fun3d_field_scalar","negative mach2");
          printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n",u_2,v_2,w_1,press_1,
                 temp_1,u2_2);
          return 1;
        }
        iVar2 = strcmp((char *)scalar_local,"mach");
        if (iVar2 == 0) {
          u._4_4_ = 1;
          dVar4 = sqrt(dStack_f0);
          *(double *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = dVar4;
        }
        else {
          iVar2 = strcmp((char *)scalar_local,"htot");
          if (iVar2 == 0) {
            u._4_4_ = 1;
            *(double *)(&ref_mpi->n + (long)gamma._4_4_ * 2) =
                 u2_2 * (1.0 / (_ref_private_macro_code_rss - 1.0)) + mach2_1 * 0.5;
          }
          else {
            iVar2 = strcmp((char *)scalar_local,"ptot");
            RVar1 = temp_1;
            if (iVar2 == 0) {
              u._4_4_ = 1;
              dVar4 = pow((_ref_private_macro_code_rss - 1.0) * 0.5 * dStack_f0 + 1.0,
                          _ref_private_macro_code_rss / (_ref_private_macro_code_rss - 1.0));
              *(double *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = RVar1 * dVar4;
            }
            else {
              iVar2 = strcmp((char *)scalar_local,"pressure");
              if (iVar2 == 0) {
                u._4_4_ = 1;
                *(REF_DBL *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = temp_1;
              }
              else {
                iVar2 = strcmp((char *)scalar_local,"density");
                if (iVar2 == 0) {
                  u._4_4_ = 1;
                  *(REF_DBL *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = u_2;
                }
                else {
                  iVar2 = strcmp((char *)scalar_local,"temperature");
                  if (iVar2 == 0) {
                    u._4_4_ = 1;
                    *(REF_DBL *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = u2_2;
                  }
                }
              }
            }
          }
        }
      }
    }
    if (u._4_4_ != 0) {
      ref_mpi_stopwatch_stop(pRStack_40,"compute compressible scalar");
    }
  }
  if (u._4_4_ == 0) {
    if (pRStack_40->id == 0) {
      printf("opening %s as solb multiscale interpolant\n",scalar_local);
    }
    uVar3 = ref_part_scalar(pRStack_18,(REF_INT *)((long)&solb_scalar + 4),&stack0xffffffffffffff00,
                            (char *)scalar_local);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xa28,"fun3d_field_scalar",(ulong)uVar3,"unable to load interpolant scalar");
      return uVar3;
    }
    if ((long)solb_scalar._4_4_ != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xa29,"fun3d_field_scalar","expected one interpolant scalar",1,(long)solb_scalar._4_4_)
      ;
      return 1;
    }
    for (gamma._4_4_ = 0; gamma._4_4_ < pRStack_18->node->max; gamma._4_4_ = gamma._4_4_ + 1) {
      if (((-1 < gamma._4_4_) && (gamma._4_4_ < pRStack_18->node->max)) &&
         (-1 < pRStack_18->node->global[gamma._4_4_])) {
        *(REF_DBL *)(&ref_mpi->n + (long)gamma._4_4_ * 2) = pRStack_100[gamma._4_4_];
      }
    }
    if (pRStack_100 != (REF_DBL *)0x0) {
      free(pRStack_100);
    }
    ref_mpi_stopwatch_stop(pRStack_40,"read interpolant from file");
  }
  return 0;
}

Assistant:

static REF_STATUS fun3d_field_scalar(REF_GRID ref_grid, REF_INT ldim,
                                     REF_DBL *initial_field,
                                     const char *interpolant, REF_DBL *scalar) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_DBL gamma = 1.4;
  REF_BOOL recognized = REF_FALSE;

  RSS(ref_validation_finite(ref_grid, ldim, initial_field), "init field");
  if (ref_mpi_once(ref_mpi)) printf("compute %s\n", interpolant);
  if (strcmp(interpolant, "incomp") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim,
        "expected 4 or more variables per vertex for incompressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL u, v, w, u2;
      u = initial_field[0 + ldim * node];
      v = initial_field[1 + ldim * node];
      w = initial_field[2 + ldim * node];
      /* press = initial_field[3 + ldim * node]; */
      u2 = u * u + v * v + w * w;
      scalar[node] = sqrt(u2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if (strcmp(interpolant, "space-time") == 0) {
    recognized = REF_TRUE;
    RAS(4 <= ldim, "expected 4 or more variables per vertex for space-time");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      press = initial_field[3 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  press = %e\n", rho, u, v, press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e press = %e  temp = %e\n", rho, u, v,
               press, temp);
      });
      scalar[node] = sqrt(mach2);
    }
    ref_mpi_stopwatch_stop(ref_mpi, "compute incompressible scalar");
  }
  if ((strcmp(interpolant, "mach") == 0) ||
      (strcmp(interpolant, "htot") == 0) ||
      (strcmp(interpolant, "ptot") == 0) ||
      (strcmp(interpolant, "pressure") == 0) ||
      (strcmp(interpolant, "density") == 0) ||
      (strcmp(interpolant, "temperature") == 0)) {
    RAS(5 <= ldim, "expected 5 or more variables per vertex for compressible");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL rho, u, v, w, press, temp, u2, mach2;
      rho = initial_field[0 + ldim * node];
      u = initial_field[1 + ldim * node];
      v = initial_field[2 + ldim * node];
      w = initial_field[3 + ldim * node];
      press = initial_field[4 + ldim * node];
      RAB(ref_math_divisible(press, rho), "can not divide by rho", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e\n", rho, u, v, w,
               press);
      });
      temp = gamma * (press / rho);
      u2 = u * u + v * v + w * w;
      RAB(ref_math_divisible(u2, temp), "can not divide by temp", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      mach2 = u2 / temp;
      RAB(mach2 >= 0, "negative mach2", {
        printf("rho = %e  u = %e  v = %e  w = %e  press = %e  temp = %e\n", rho,
               u, v, w, press, temp);
      });
      if (strcmp(interpolant, "mach") == 0) {
        recognized = REF_TRUE;
        scalar[node] = sqrt(mach2);
      } else if (strcmp(interpolant, "htot") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp * (1.0 / (gamma - 1.0)) + 0.5 * u2;
      } else if (strcmp(interpolant, "ptot") == 0) {
        recognized = REF_TRUE;
        scalar[node] =
            press * pow(1.0 + 0.5 * (gamma - 1.0) * mach2, gamma / (gamma - 1));
      } else if (strcmp(interpolant, "pressure") == 0) {
        recognized = REF_TRUE;
        scalar[node] = press;
      } else if (strcmp(interpolant, "density") == 0) {
        recognized = REF_TRUE;
        scalar[node] = rho;
      } else if (strcmp(interpolant, "temperature") == 0) {
        recognized = REF_TRUE;
        scalar[node] = temp;
      }
    }
    if (recognized)
      ref_mpi_stopwatch_stop(ref_mpi, "compute compressible scalar");
  }

  if (!recognized) {
    REF_INT solb_ldim;
    REF_DBL *solb_scalar;
    if (ref_mpi_once(ref_mpi))
      printf("opening %s as solb multiscale interpolant\n", interpolant);
    RSS(ref_part_scalar(ref_grid, &solb_ldim, &solb_scalar, interpolant),
        "unable to load interpolant scalar");
    REIS(1, solb_ldim, "expected one interpolant scalar");
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      scalar[node] = solb_scalar[node];
    }
    ref_free(solb_scalar);
    ref_mpi_stopwatch_stop(ref_mpi, "read interpolant from file");
  }

  return REF_SUCCESS;
}